

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysis.h
# Opt level: O1

void __thiscall dg::pta::PointerAnalysis::initialize_queue(PointerAnalysis *this)

{
  PSNode *root;
  PSNode *local_30;
  vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_> local_28;
  
  local_30 = *(PSNode **)(this->PG->_entry + 0x58);
  PointerGraph::getNodes<dg::pta::PSNode*>(&local_28,this->PG,&local_30,true,0);
  std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>::_M_move_assign
            (&this->to_process,&local_28);
  if (local_28.super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.
                    super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.
                          super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void initialize_queue() {
        assert(to_process.empty());

        PSNode *root = PG->getEntry()->getRoot();
        assert(root && "Do not have root of PG");
        // rely on C++11 move semantics
        to_process = PG->getNodes(root);
    }